

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O3

void __thiscall
Am_Text_Fragment::Am_Text_Fragment
          (Am_Text_Fragment *this,Am_Rich_Text_Data *inTextObject,char *inString)

{
  size_t __n;
  Am_Text_Fragment *this_00;
  
  this->mType = 0x8008;
  this->mTextObject = inTextObject;
  this->mStartIndex = 0;
  this->mFirstMark = (Am_Text_Mark *)0x0;
  this->mPrev = (Am_Text_Fragment *)0x0;
  this->mNext = (Am_Text_Fragment *)0x0;
  __n = strlen(inString);
  if (0x400 < __n) {
    this->mStrLen = 0x400;
    memmove(this->mString,inString,0x400);
    this_00 = (Am_Text_Fragment *)operator_new(0x438);
    Am_Text_Fragment(this_00,inTextObject,(char *)(this + 1));
    this->mNext = this_00;
    return;
  }
  this->mStrLen = __n;
  memmove(this->mString,inString,__n);
  return;
}

Assistant:

Am_Text_Fragment::Am_Text_Fragment(Am_Rich_Text_Data *inTextObject,
                                   const char *inString)
{
  mType = Am_STRING;
  mTextObject = inTextObject;
  mStartIndex = 0;
  mFirstMark = nullptr;
  mPrev = mNext = nullptr;

  Am_Text_Length stringLen = strlen(inString);

  if (stringLen > kFragStrSize) {
    mStrLen = kFragStrSize;
    memmove(mString, inString, (int)mStrLen);
    mNext = new Am_Text_Fragment(inTextObject, mString + kFragStrSize);
  } else {
    mStrLen = stringLen;
    memmove(mString, inString, (int)mStrLen);
  }
}